

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioutils.cpp
# Opt level: O2

QStringView QMakeInternal::IoUtils::fileName(QString *fileName)

{
  qsizetype qVar1;
  long in_FS_OFFSET;
  QStringView QVar2;
  QStringView local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.m_data = (fileName->d).ptr;
  local_20.m_size = (fileName->d).size;
  qVar1 = QString::lastIndexOf(fileName,(QChar)0x2f,CaseSensitive);
  QVar2 = QStringView::mid(&local_20,qVar1 + 1,-1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QStringView IoUtils::fileName(const QString &fileName)
{
    return QStringView(fileName).mid(fileName.lastIndexOf(QLatin1Char('/')) + 1);
}